

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcapistd.c
# Opt level: O2

void jpeg_start_compress(j_compress_ptr cinfo,boolean write_all_tables)

{
  int iVar1;
  jpeg_error_mgr *pjVar2;
  
  iVar1 = cinfo->global_state;
  if (iVar1 != 100) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x15;
    (pjVar2->msg_parm).i[0] = iVar1;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  if (write_all_tables != 0) {
    jpeg_suppress_tables(cinfo,0);
  }
  (*cinfo->err->reset_error_mgr)((j_common_ptr)cinfo);
  (*cinfo->dest->init_destination)(cinfo);
  jinit_compress_master(cinfo);
  (*cinfo->master->prepare_for_pass)(cinfo);
  cinfo->next_scanline = 0;
  cinfo->global_state = 0x66 - (uint)(cinfo->raw_data_in == 0);
  return;
}

Assistant:

GLOBAL(void)
jpeg_start_compress (j_compress_ptr cinfo, boolean write_all_tables)
{
  if (cinfo->global_state != CSTATE_START)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);

  if (write_all_tables)
    jpeg_suppress_tables(cinfo, FALSE);	/* mark all tables to be written */

  /* (Re)initialize error mgr and destination modules */
  (*cinfo->err->reset_error_mgr) ((j_common_ptr) cinfo);
  (*cinfo->dest->init_destination) (cinfo);
  /* Perform master selection of active modules */
  jinit_compress_master(cinfo);
  /* Set up for the first pass */
  (*cinfo->master->prepare_for_pass) (cinfo);
  /* Ready for application to drive first pass through jpeg_write_scanlines
   * or jpeg_write_raw_data.
   */
  cinfo->next_scanline = 0;
  cinfo->global_state = (cinfo->raw_data_in ? CSTATE_RAW_OK : CSTATE_SCANNING);
}